

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<const_SDL_Surface_*> * __thiscall
testing::internal::MatcherBase<const_SDL_Surface_*>::operator=
          (MatcherBase<const_SDL_Surface_*> *this,MatcherBase<const_SDL_Surface_*> *other)

{
  MatcherBase<const_SDL_Surface_*> *other_local;
  MatcherBase<const_SDL_Surface_*> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }